

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

double duckdb::DatePart::JulianDayOperator::Operation<duckdb::interval_t,double>(interval_t input)

{
  NotImplementedException *this;
  allocator local_31;
  string local_30 [48];
  
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"interval units \"julian\" not recognized",&local_31);
  duckdb::NotImplementedException::NotImplementedException(this,local_30);
  __cxa_throw(this,&NotImplementedException::typeinfo,
              NotImplementedException::~NotImplementedException);
}

Assistant:

double DatePart::JulianDayOperator::Operation(interval_t input) {
	throw NotImplementedException("interval units \"julian\" not recognized");
}